

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

void __thiscall
OpenMesh::PolyConnectivity::split_edge(PolyConnectivity *this,EdgeHandle _eh,VertexHandle _vh)

{
  HalfedgeHandle _heh;
  bool bVar1;
  bool bVar2;
  VertexHandle _vh_00;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _nheh;
  VertexHandle _start_vh;
  HalfedgeHandle _heh_01;
  FaceHandle FVar3;
  BaseHandle BVar4;
  Halfedge *pHVar5;
  Vertex *pVVar6;
  HalfedgeHandle _nheh_00;
  HalfedgeHandle _heh_02;
  
  _heh_02.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1);
  _heh.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
  _vh_00 = ArrayKernel::from_vertex_handle(&this->super_ArrayKernel,_heh);
  _heh_00 = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,_heh.super_BaseHandle.idx_);
  _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,_heh_02);
  bVar1 = ArrayKernel::is_boundary(&this->super_ArrayKernel,_heh);
  bVar2 = ArrayKernel::is_boundary(&this->super_ArrayKernel,_heh_02);
  _start_vh = ArrayKernel::from_vertex_handle(&this->super_ArrayKernel,_heh);
  _heh_01 = ArrayKernel::new_edge(&this->super_ArrayKernel,_start_vh,_vh);
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  (pHVar5->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
       (int)_vh.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_01,_heh);
  _nheh_00.super_BaseHandle.idx_ =
       (BaseHandle)
       ((-((uint)_heh_01.super_BaseHandle.idx_ & 1) | 1) + (int)_heh_01.super_BaseHandle.idx_);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_02,_nheh_00);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_heh_01);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_nheh_00,_nheh);
  if (bVar1) {
    ArrayKernel::set_boundary(&this->super_ArrayKernel,_heh_01);
  }
  else {
    FVar3 = ArrayKernel::face_handle(&this->super_ArrayKernel,_heh);
    pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
    (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
         (int)FVar3.super_BaseHandle.idx_;
  }
  if (bVar2) {
    ArrayKernel::set_boundary(&this->super_ArrayKernel,_nheh_00);
  }
  else {
    FVar3 = ArrayKernel::face_handle(&this->super_ArrayKernel,_heh_02);
    pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh_00);
    (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
         (int)FVar3.super_BaseHandle.idx_;
  }
  pVVar6 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  (pVVar6->halfedge_handle_).super_BaseHandle.idx_ = (int)_heh.super_BaseHandle.idx_;
  adjust_outgoing_halfedge(this,_vh);
  BVar4.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_vh_00);
  if ((BaseHandle)BVar4.idx_ == _heh.super_BaseHandle.idx_) {
    pVVar6 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh_00);
    (pVVar6->halfedge_handle_).super_BaseHandle.idx_ = (int)_heh_01.super_BaseHandle.idx_;
    adjust_outgoing_halfedge(this,_vh_00);
    return;
  }
  return;
}

Assistant:

void PolyConnectivity::split_edge(EdgeHandle _eh, VertexHandle _vh)
{
  HalfedgeHandle h0 = halfedge_handle(_eh, 0);
  HalfedgeHandle h1 = halfedge_handle(_eh, 1);
  
  VertexHandle vfrom = from_vertex_handle(h0);

  HalfedgeHandle ph0 = prev_halfedge_handle(h0);
  //HalfedgeHandle ph1 = prev_halfedge_handle(h1);
  
  //HalfedgeHandle nh0 = next_halfedge_handle(h0);
  HalfedgeHandle nh1 = next_halfedge_handle(h1);
  
  bool boundary0 = is_boundary(h0);
  bool boundary1 = is_boundary(h1);
  
  //add the new edge
  HalfedgeHandle new_e = new_edge(from_vertex_handle(h0), _vh);
  
  //fix the vertex of the opposite halfedge
  set_vertex_handle(h1, _vh);
  
  //fix the halfedge connectivity
  set_next_halfedge_handle(new_e, h0);
  set_next_halfedge_handle(h1, opposite_halfedge_handle(new_e));
  
  set_next_halfedge_handle(ph0, new_e);
  set_next_halfedge_handle(opposite_halfedge_handle(new_e), nh1);
  
//  set_prev_halfedge_handle(new_e, ph0);
//  set_prev_halfedge_handle(opposite_halfedge_handle(new_e), h1);
  
//  set_prev_halfedge_handle(nh1, opposite_halfedge_handle(new_e));
//  set_prev_halfedge_handle(h0, new_e);
  
  if (!boundary0)
  {
    set_face_handle(new_e, face_handle(h0));
  }
  else
  {
    set_boundary(new_e);
  }
  
  if (!boundary1)
  {
    set_face_handle(opposite_halfedge_handle(new_e), face_handle(h1));
  }
  else
  {
    set_boundary(opposite_halfedge_handle(new_e));
  }

  set_halfedge_handle( _vh, h0 );
  adjust_outgoing_halfedge( _vh );
  
  if (halfedge_handle(vfrom) == h0)
  {
    set_halfedge_handle(vfrom, new_e);
    adjust_outgoing_halfedge( vfrom );
  }
}